

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O0

ResetPtr __thiscall libcellml::Component::reset(Component *this,size_t index)

{
  ComponentImpl *pCVar1;
  size_type sVar2;
  const_reference pvVar3;
  ulong in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  ResetPtr RVar5;
  size_t index_local;
  Component *this_local;
  
  pCVar1 = pFunc((Component *)index);
  sVar2 = std::
          vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>
          ::size(&pCVar1->mResets);
  if (in_RDX < sVar2) {
    pCVar1 = pFunc((Component *)index);
    pvVar3 = std::
             vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>
             ::at(&pCVar1->mResets,in_RDX);
    std::shared_ptr<libcellml::Reset>::shared_ptr((shared_ptr<libcellml::Reset> *)this,pvVar3);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    std::shared_ptr<libcellml::Reset>::shared_ptr
              ((shared_ptr<libcellml::Reset> *)this,(nullptr_t)0x0);
    _Var4._M_pi = extraout_RDX_00;
  }
  RVar5.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  RVar5.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ResetPtr)RVar5.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ResetPtr Component::reset(size_t index) const
{
    if (index < pFunc()->mResets.size()) {
        return pFunc()->mResets.at(index);
    }

    return nullptr;
}